

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::MergeReturnPass::CreateContinueTarget(MergeReturnPass *this,uint32_t header_label_id)

{
  bool bVar1;
  uint32_t res_id;
  Analysis preserved_analyses;
  Instruction *pIVar2;
  IRContext *pIVar3;
  BasicBlock *this_00;
  reference pvVar4;
  CFG *this_01;
  undefined1 local_c8 [8];
  InstructionBuilder builder;
  type local_a0;
  reference local_90;
  value_type *new_block;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> local_78;
  iterator local_68;
  undefined1 local_58 [8];
  iterator pos;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_40;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> block;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_20;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> label;
  uint32_t header_label_id_local;
  MergeReturnPass *this_local;
  
  label._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = header_label_id;
  pIVar2 = (Instruction *)operator_new(0x70);
  pIVar3 = Pass::context((Pass *)this);
  res_id = Pass::TakeNextId((Pass *)this);
  memset(&block,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&block);
  Instruction::Instruction(pIVar2,pIVar3,OpLabel,0,res_id,(OperandList *)&block);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_20,pIVar2);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&block);
  this_00 = (BasicBlock *)operator_new(0x88);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&pos.iterator_,&local_20);
  BasicBlock::BasicBlock
            (this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&pos.iterator_);
  std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
  unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
            ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>> *
             )&local_40,this_00);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               *)&pos.iterator_);
  _local_58 = Function::end(this->function_);
  local_68 = Function::begin(this->function_);
  bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                    ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58,&local_68);
  if (!bVar1) {
    __assert_fail("pos != function_->begin()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                  ,0x326,
                  "BasicBlock *spvtools::opt::MergeReturnPass::CreateContinueTarget(uint32_t)");
  }
  local_78 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator--
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58,0);
  _new_block = Function::begin(this->function_);
  bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                    ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58,
                     (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&new_block);
  if (bVar1) {
    pvVar4 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58);
    if (pvVar4 != this->final_return_block_) {
      __assert_fail("&*pos == final_return_block_",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                    ,0x329,
                    "BasicBlock *spvtools::opt::MergeReturnPass::CreateContinueTarget(uint32_t)");
    }
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                *)&builder.preserved_analyses_,&local_40);
    local_a0 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58,
                          (Uptr *)&builder.preserved_analyses_);
    pvVar4 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*(&local_a0);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&builder.preserved_analyses_);
    local_90 = pvVar4;
    BasicBlock::SetParent(pvVar4,this->function_);
    pIVar3 = Pass::context((Pass *)this);
    pIVar2 = BasicBlock::GetLabelInst(local_90);
    IRContext::AnalyzeDefUse(pIVar3,pIVar2);
    pIVar3 = Pass::context((Pass *)this);
    pIVar2 = BasicBlock::GetLabelInst(local_90);
    IRContext::set_instr_block(pIVar3,pIVar2,local_90);
    pIVar3 = Pass::context((Pass *)this);
    pvVar4 = local_90;
    preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
    InstructionBuilder::InstructionBuilder
              ((InstructionBuilder *)local_c8,pIVar3,pvVar4,preserved_analyses);
    InstructionBuilder::AddBranch
              ((InstructionBuilder *)local_c8,
               label._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_);
    pIVar3 = Pass::context((Pass *)this);
    bVar1 = IRContext::AreAnalysesValid(pIVar3,kAnalysisCFG);
    if (bVar1) {
      this_01 = Pass::cfg((Pass *)this);
      CFG::RegisterBlock(this_01,local_90);
    }
    pvVar4 = local_90;
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr(&local_40);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_20);
    return pvVar4;
  }
  __assert_fail("pos != function_->begin()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                ,0x328,"BasicBlock *spvtools::opt::MergeReturnPass::CreateContinueTarget(uint32_t)")
  ;
}

Assistant:

BasicBlock* MergeReturnPass::CreateContinueTarget(uint32_t header_label_id) {
  std::unique_ptr<Instruction> label(
      new Instruction(context(), spv::Op::OpLabel, 0u, TakeNextId(), {}));

  // Create the new basic block
  std::unique_ptr<BasicBlock> block(new BasicBlock(std::move(label)));

  // Insert the new block just before the return block
  auto pos = function_->end();
  assert(pos != function_->begin());
  pos--;
  assert(pos != function_->begin());
  assert(&*pos == final_return_block_);
  auto new_block = &*pos.InsertBefore(std::move(block));
  new_block->SetParent(function_);

  context()->AnalyzeDefUse(new_block->GetLabelInst());
  context()->set_instr_block(new_block->GetLabelInst(), new_block);

  InstructionBuilder builder(
      context(), new_block,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  builder.AddBranch(header_label_id);

  if (context()->AreAnalysesValid(IRContext::kAnalysisCFG)) {
    cfg()->RegisterBlock(new_block);
  }

  return new_block;
}